

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O0

char * helicsFilterGetTag(HelicsFilter filt,char *tagname)

{
  string_view tag;
  FilterObject *pFVar1;
  string *this;
  long in_RSI;
  string *info;
  FilterObject *filtObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  HelicsFilter in_stack_ffffffffffffff78;
  Interface *in_stack_ffffffffffffff80;
  Filter *pFVar2;
  char *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffffa0;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffffa7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *local_8;
  
  pFVar1 = anon_unknown.dwarf_88686::getFilterObj
                     (in_stack_ffffffffffffff78,(HelicsError *)in_stack_ffffffffffffff70);
  if (pFVar1 == (FilterObject *)0x0) {
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (in_stack_ffffffffffffff70);
  }
  else {
    pFVar2 = pFVar1->filtPtr;
    bVar3 = 0;
    if (in_RSI == 0) {
      std::__cxx11::string::string(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    else {
      in_stack_ffffffffffffff80 = (Interface *)&stack0xffffffffffffffa7;
      std::allocator<char>::allocator();
      bVar3 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffffa7,CONCAT16(1,in_stack_ffffffffffffffa0)));
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff70);
    tag._M_str = in_stack_ffffffffffffff90;
    tag._M_len = (size_t)pFVar2;
    this = helics::Interface::getTag_abi_cxx11_(in_stack_ffffffffffffff80,tag);
    std::__cxx11::string::~string(this);
    if ((bVar3 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    }
    local_8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (this);
  }
  return local_8;
}

Assistant:

const char* helicsFilterGetTag(HelicsFilter filt, const char* tagname)
{
    auto* filtObj = getFilterObj(filt, nullptr);
    if (filtObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = filtObj->filtPtr->getTag(AS_STRING(tagname));
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}